

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall
ON_SubDMeshFragment::SetControlNetQuad
          (ON_SubDMeshFragment *this,bool bGridOrder,ON_3dPoint *quad_points,ON_3dVector quad_normal
          )

{
  bool bVar1;
  int iVar2;
  int i;
  ON_3dPoint *quad_points_local;
  bool bGridOrder_local;
  ON_SubDMeshFragment *this_local;
  
  if ((((quad_points == (ON_3dPoint *)0x0) || (bVar1 = ON_3dPoint::IsValid(quad_points), !bVar1)) ||
      (bVar1 = ON_3dPoint::IsValid(quad_points + 1), !bVar1)) ||
     (((bVar1 = ON_3dPoint::IsValid(quad_points + 2), !bVar1 ||
       (bVar1 = ON_3dPoint::IsValid(quad_points + 3), !bVar1)) ||
      (bVar1 = ON_3dVector::IsNotZero(&quad_normal), !bVar1)))) {
    ClearControlNetQuad(this);
  }
  else {
    this->m_ctrlnetP[0][0] = quad_points->x;
    this->m_ctrlnetP[0][1] = quad_points->y;
    this->m_ctrlnetP[0][2] = quad_points->z;
    this->m_ctrlnetP[1][0] = quad_points[1].x;
    this->m_ctrlnetP[1][1] = quad_points[1].y;
    this->m_ctrlnetP[1][2] = quad_points[1].z;
    iVar2 = 3;
    if (bGridOrder) {
      iVar2 = 2;
    }
    this->m_ctrlnetP[iVar2][0] = quad_points[2].x;
    this->m_ctrlnetP[iVar2][1] = quad_points[2].y;
    this->m_ctrlnetP[iVar2][2] = quad_points[2].z;
    iVar2 = 2;
    if (bGridOrder) {
      iVar2 = 3;
    }
    this->m_ctrlnetP[iVar2][0] = quad_points[3].x;
    this->m_ctrlnetP[iVar2][1] = quad_points[3].y;
    this->m_ctrlnetP[iVar2][2] = quad_points[3].z;
    this->m_ctrlnetN[0] = quad_normal.x;
    this->m_ctrlnetN[1] = quad_normal.y;
    this->m_ctrlnetN[2] = quad_normal.z;
    this->m_vertex_count_etc = this->m_vertex_count_etc | 0x8000;
  }
  return;
}

Assistant:

void ON_SubDMeshFragment::SetControlNetQuad(bool bGridOrder, const ON_3dPoint quad_points[4], ON_3dVector quad_normal )
{
  if (nullptr != quad_points && quad_points[0].IsValid() && quad_points[1].IsValid() && quad_points[2].IsValid() && quad_points[3].IsValid() && quad_normal.IsNotZero())
  {
    int i;

    m_ctrlnetP[0][0] = quad_points[0].x;
    m_ctrlnetP[0][1] = quad_points[0].y;
    m_ctrlnetP[0][2] = quad_points[0].z;

    m_ctrlnetP[1][0] = quad_points[1].x;
    m_ctrlnetP[1][1] = quad_points[1].y;
    m_ctrlnetP[1][2] = quad_points[1].z;

    i = bGridOrder ? 2 : 3;
    m_ctrlnetP[i][0] = quad_points[2].x;
    m_ctrlnetP[i][1] = quad_points[2].y;
    m_ctrlnetP[i][2] = quad_points[2].z;

    i = bGridOrder ? 3 : 2;
    m_ctrlnetP[i][0] = quad_points[3].x;
    m_ctrlnetP[i][1] = quad_points[3].y;
    m_ctrlnetP[i][2] = quad_points[3].z;

    m_ctrlnetN[0] = quad_normal.x;
    m_ctrlnetN[1] = quad_normal.y;
    m_ctrlnetN[2] = quad_normal.z;
    m_vertex_count_etc |= ON_SubDMeshFragment::EtcControlNetQuadBit;
  }
  else
  {
    ClearControlNetQuad();
  }
}